

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

cmNinjaBuild *
anon_unknown.dwarf_ec3537::GetScanBuildStatement
          (cmNinjaBuild *__return_storage_ptr__,string *ruleName,string *ppFileName,bool compilePP,
          bool compilePPWithDefines,cmNinjaBuild *objBuild,cmNinjaVars *vars,string *modmapFormat,
          string *objectFileName,cmLocalGenerator *lg)

{
  value_type *pvVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  reference str;
  ulong uVar4;
  allocator<char> local_4f1;
  key_type local_4f0;
  cmAlphaNum local_4d0;
  cmAlphaNum local_4a0;
  undefined1 local_470 [8];
  string ddModmapFile;
  key_type local_448;
  allocator<char> local_421;
  key_type local_420;
  string_view local_400;
  string local_3f0;
  cmAlphaNum local_3d0;
  cmAlphaNum local_3a0;
  string local_370;
  string *local_350;
  string *depFileName;
  key_type local_340;
  allocator<char> local_319;
  key_type local_318;
  cmAlphaNum local_2f8;
  cmAlphaNum local_2c8;
  string local_298;
  string *local_278;
  string *ddiFile;
  key_type local_268;
  allocator<char> local_241;
  key_type local_240;
  allocator<char> local_219;
  key_type local_218;
  allocator<char> local_1f1;
  key_type local_1f0;
  allocator<char> local_1c9;
  key_type local_1c8;
  allocator<char> local_1a1;
  key_type local_1a0;
  allocator<char> local_179;
  key_type local_178;
  allocator<char> local_151;
  key_type local_150;
  allocator<char> local_129;
  key_type local_128;
  allocator<char> local_101;
  key_type local_100;
  allocator<char> local_d9;
  key_type local_d8;
  allocator<char> local_b1;
  key_type local_b0;
  allocator<char> local_89;
  key_type local_88;
  string local_58;
  byte local_31;
  cmNinjaBuild *local_30;
  cmNinjaBuild *objBuild_local;
  bool compilePPWithDefines_local;
  string *psStack_20;
  bool compilePP_local;
  string *ppFileName_local;
  string *ruleName_local;
  cmNinjaBuild *scanBuild;
  
  local_31 = 0;
  local_30 = objBuild;
  objBuild_local._6_1_ = compilePPWithDefines;
  objBuild_local._7_1_ = compilePP;
  psStack_20 = ppFileName;
  ppFileName_local = ruleName;
  ruleName_local = &__return_storage_ptr__->Comment;
  std::__cxx11::string::string((string *)&local_58,(string *)ruleName);
  cmNinjaBuild::cmNinjaBuild(__return_storage_ptr__,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->RspFile,"$out.rsp");
  if ((objBuild_local._7_1_ & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&__return_storage_ptr__->ExplicitDeps,&local_30->ExplicitDeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&__return_storage_ptr__->ImplicitDeps,&local_30->ImplicitDeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&__return_storage_ptr__->OrderOnlyDeps,&local_30->OrderOnlyDeps);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"IN_ABS",&local_d9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"IN_ABS",&local_101);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&__return_storage_ptr__->Variables,&local_100);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)pmVar2);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
  }
  else {
    std::swap<std::__cxx11::string,std::allocator<std::__cxx11::string>>
              (&__return_storage_ptr__->ExplicitDeps,&local_30->ExplicitDeps);
    std::swap<std::__cxx11::string,std::allocator<std::__cxx11::string>>
              (&__return_storage_ptr__->ImplicitDeps,&local_30->ImplicitDeps);
    std::swap<std::__cxx11::string,std::allocator<std::__cxx11::string>>
              (&__return_storage_ptr__->OrderOnlyDeps,&local_30->OrderOnlyDeps);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"IN_ABS",&local_89);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&__return_storage_ptr__->Variables,&local_88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"IN_ABS",&local_b1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_b0);
    std::swap<char,std::char_traits<char>,std::allocator<char>>(pmVar2,pmVar3);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_30->ExplicitDeps,psStack_20);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"FLAGS",&local_129);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"FLAGS",&local_151);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&__return_storage_ptr__->Variables,&local_150);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)pmVar2);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  if (((objBuild_local._7_1_ & 1) == 0) || ((objBuild_local._6_1_ & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"DEFINES",&local_1c9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_1c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"DEFINES",&local_1f1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&__return_storage_ptr__->Variables,&local_1f0);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)pmVar2);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"DEFINES",&local_179);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&__return_storage_ptr__->Variables,&local_178);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"DEFINES",&local_1a1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_1a0);
    std::swap<char,std::char_traits<char>,std::allocator<char>>(pmVar2,pmVar3);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"INCLUDES",&local_219);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"INCLUDES",&local_241);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&__return_storage_ptr__->Variables,&local_240);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)pmVar2);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"OBJ_FILE",(allocator<char> *)((long)&ddiFile + 7));
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&__return_storage_ptr__->Variables,&local_268);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)objectFileName);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ddiFile + 7));
  cmAlphaNum::cmAlphaNum(&local_2c8,objectFileName);
  cmAlphaNum::cmAlphaNum(&local_2f8,".ddi");
  cmStrCat<>(&local_298,&local_2c8,&local_2f8);
  local_278 = &local_298;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"DYNDEP_INTERMEDIATE_FILE",&local_319);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&__return_storage_ptr__->Variables,&local_318);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_298);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  if ((objBuild_local._7_1_ & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&__return_storage_ptr__->Outputs,local_278);
    pvVar1 = psStack_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"PREPROCESSED_OUTPUT_FILE",
               (allocator<char> *)((long)&depFileName + 7));
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&__return_storage_ptr__->Variables,&local_340);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)pvVar1);
    std::__cxx11::string::~string((string *)&local_340);
    std::allocator<char>::~allocator((allocator<char> *)((long)&depFileName + 7));
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&__return_storage_ptr__->Outputs,psStack_20);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&__return_storage_ptr__->ImplicitOuts,local_278);
  }
  str = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::front(&__return_storage_ptr__->Outputs);
  cmAlphaNum::cmAlphaNum(&local_3a0,str);
  cmAlphaNum::cmAlphaNum(&local_3d0,".d");
  cmStrCat<>(&local_370,&local_3a0,&local_3d0);
  local_350 = &local_370;
  local_400 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_350);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_3f0,&lg->super_cmOutputConverter,local_400,SHELL);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"DEP_FILE",&local_421);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&__return_storage_ptr__->Variables,&local_420);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator(&local_421);
  std::__cxx11::string::~string((string *)&local_3f0);
  if ((objBuild_local._7_1_ & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,"DEP_FILE",
               (allocator<char> *)(ddModmapFile.field_2._M_local_buf + 0xf));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::erase(vars,&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator((allocator<char> *)(ddModmapFile.field_2._M_local_buf + 0xf));
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_4a0,objectFileName);
    cmAlphaNum::cmAlphaNum(&local_4d0,".modmap");
    cmStrCat<>((string *)local_470,&local_4a0,&local_4d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f0,"DYNDEP_MODULE_MAP_FILE",&local_4f1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&__return_storage_ptr__->Variables,&local_4f0);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)local_470);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::allocator<char>::~allocator(&local_4f1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&__return_storage_ptr__->ImplicitOuts,(value_type *)local_470);
    std::__cxx11::string::~string((string *)local_470);
  }
  local_31 = 1;
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_298);
  if ((local_31 & 1) == 0) {
    cmNinjaBuild::~cmNinjaBuild(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

cmNinjaBuild GetScanBuildStatement(const std::string& ruleName,
                                   const std::string& ppFileName,
                                   bool compilePP, bool compilePPWithDefines,
                                   cmNinjaBuild& objBuild, cmNinjaVars& vars,
                                   std::string const& modmapFormat,
                                   const std::string& objectFileName,
                                   cmLocalGenerator* lg)
{
  cmNinjaBuild scanBuild(ruleName);

  scanBuild.RspFile = "$out.rsp";

  if (compilePP) {
    // Move compilation dependencies to the scan/preprocessing build statement.
    std::swap(scanBuild.ExplicitDeps, objBuild.ExplicitDeps);
    std::swap(scanBuild.ImplicitDeps, objBuild.ImplicitDeps);
    std::swap(scanBuild.OrderOnlyDeps, objBuild.OrderOnlyDeps);
    std::swap(scanBuild.Variables["IN_ABS"], vars["IN_ABS"]);

    // The actual compilation will now use the preprocessed source.
    objBuild.ExplicitDeps.push_back(ppFileName);
  } else {
    // Copy compilation dependencies to the scan/preprocessing build statement.
    scanBuild.ExplicitDeps = objBuild.ExplicitDeps;
    scanBuild.ImplicitDeps = objBuild.ImplicitDeps;
    scanBuild.OrderOnlyDeps = objBuild.OrderOnlyDeps;
    scanBuild.Variables["IN_ABS"] = vars["IN_ABS"];
  }

  // Scanning and compilation generally use the same flags.
  scanBuild.Variables["FLAGS"] = vars["FLAGS"];

  if (compilePP && !compilePPWithDefines) {
    // Move preprocessor definitions to the scan/preprocessor build statement.
    std::swap(scanBuild.Variables["DEFINES"], vars["DEFINES"]);
  } else {
    // Copy preprocessor definitions to the scan/preprocessor build statement.
    scanBuild.Variables["DEFINES"] = vars["DEFINES"];
  }

  // Copy include directories to the preprocessor build statement.  The
  // Fortran compilation build statement still needs them for the INCLUDE
  // directive.
  scanBuild.Variables["INCLUDES"] = vars["INCLUDES"];

  // Tell dependency scanner the object file that will result from
  // compiling the source.
  scanBuild.Variables["OBJ_FILE"] = objectFileName;

  // Tell dependency scanner where to store dyndep intermediate results.
  std::string const& ddiFile = cmStrCat(objectFileName, ".ddi");
  scanBuild.Variables["DYNDEP_INTERMEDIATE_FILE"] = ddiFile;

  // Outputs of the scan/preprocessor build statement.
  if (compilePP) {
    scanBuild.Outputs.push_back(ppFileName);
    scanBuild.ImplicitOuts.push_back(ddiFile);
  } else {
    scanBuild.Outputs.push_back(ddiFile);
    scanBuild.Variables["PREPROCESSED_OUTPUT_FILE"] = ppFileName;
  }

  // Scanning always provides a depfile for preprocessor dependencies. This
  // variable is unused in `msvc`-deptype scanners.
  std::string const& depFileName = cmStrCat(scanBuild.Outputs.front(), ".d");
  scanBuild.Variables["DEP_FILE"] =
    lg->ConvertToOutputFormat(depFileName, cmOutputConverter::SHELL);
  if (compilePP) {
    // The actual compilation does not need a depfile because it
    // depends on the already-preprocessed source.
    vars.erase("DEP_FILE");
  }

  if (!modmapFormat.empty()) {
    // XXX(modmap): If changing this path construction, change
    // `cmGlobalNinjaGenerator::WriteDyndep` to expect the corresponding
    // file path.
    std::string const ddModmapFile = cmStrCat(objectFileName, ".modmap");
    scanBuild.Variables["DYNDEP_MODULE_MAP_FILE"] = ddModmapFile;
    scanBuild.ImplicitOuts.push_back(ddModmapFile);
  }

  return scanBuild;
}